

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ring_buffer.cpp
# Opt level: O1

void __thiscall cubeb_ring_buffer_Test::TestBody(cubeb_ring_buffer_Test *this)

{
  size_t channels;
  ulong uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  lock_free_audio_ring_buffer<float> q3;
  lock_free_audio_ring_buffer<short> q4;
  lock_free_queue<short> q2;
  lock_free_queue<float> q1;
  int local_b0;
  audio_ring_buffer_base<float> local_a8;
  ulong local_88;
  audio_ring_buffer_base<short> local_80;
  ring_buffer_base<short> local_60;
  ring_buffer_base<float> local_48;
  
  iVar3 = 0x81;
  local_48.capacity_ = 0x81;
  local_48.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
       (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
  uVar1 = 0x204;
  local_48.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(0x204);
  LOCK();
  local_48.write_index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  LOCK();
  local_48.read_index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  basic_api_test<ring_buffer_base<float>>(&local_48);
  local_60.capacity_ = 0x81;
  local_60.data_._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
  super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
  super__Head_base<0UL,_short_*,_false>._M_head_impl =
       (__uniq_ptr_data<short,_std::default_delete<short[]>,_true,_true>)
       (__uniq_ptr_impl<short,_std::default_delete<short[]>_>)0x0;
  uVar5 = 0x102;
  local_60.data_._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
  super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
  super__Head_base<0UL,_short_*,_false>._M_head_impl =
       (__uniq_ptr_data<short,_std::default_delete<short[]>,_true,_true>)operator_new__(0x102);
  LOCK();
  local_60.write_index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  LOCK();
  local_60.read_index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  basic_api_test<ring_buffer_base<short>>(&local_60);
  iVar6 = 1;
  do {
    local_a8.ring_buffer.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
    .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
         (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
    local_a8.channel_count = iVar6;
    local_a8.ring_buffer.capacity_ = iVar3;
    local_a8.ring_buffer.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t
    .super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(uVar1);
    LOCK();
    local_a8.ring_buffer.write_index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    UNLOCK();
    LOCK();
    local_a8.ring_buffer.read_index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    UNLOCK();
    basic_api_test<audio_ring_buffer_base<float>>(&local_a8);
    local_80.ring_buffer.data_._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t
    .super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
    super__Head_base<0UL,_short_*,_false>._M_head_impl =
         (__uniq_ptr_data<short,_std::default_delete<short[]>,_true,_true>)
         (__uniq_ptr_impl<short,_std::default_delete<short[]>_>)0x0;
    local_80.channel_count = iVar6;
    local_80.ring_buffer.capacity_ = iVar3;
    local_80.ring_buffer.data_._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t
    .super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
    super__Head_base<0UL,_short_*,_false>._M_head_impl =
         (__uniq_ptr_data<short,_std::default_delete<short[]>,_true,_true>)operator_new__(uVar5);
    LOCK();
    local_80.ring_buffer.write_index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    UNLOCK();
    LOCK();
    local_80.ring_buffer.read_index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    UNLOCK();
    basic_api_test<audio_ring_buffer_base<short>>(&local_80);
    if (local_80.ring_buffer.data_._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>.
        _M_t.super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
        super__Head_base<0UL,_short_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<short,_std::default_delete<short[]>_>)0x0) {
      operator_delete__((void *)local_80.ring_buffer.data_._M_t.
                                super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
                                super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                                super__Head_base<0UL,_short_*,_false>._M_head_impl);
    }
    if (local_a8.ring_buffer.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
        _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
        super__Head_base<0UL,_float_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
      operator_delete__((void *)local_a8.ring_buffer.data_._M_t.
                                super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                super__Head_base<0UL,_float_*,_false>._M_head_impl);
    }
    uVar5 = uVar5 + 0x100;
    uVar1 = uVar1 + 0x200;
    iVar3 = iVar3 + 0x80;
    iVar6 = iVar6 + 1;
  } while (uVar5 != 0xa02);
  lVar2 = 1;
  iVar3 = 199;
  local_b0 = 0x1b;
  uVar1 = 800;
  lVar7 = 0x6c;
  do {
    uVar5 = 0xac;
    iVar6 = iVar3;
    local_88 = uVar1;
    do {
      local_a8.ring_buffer.capacity_ = iVar6 + 1;
      local_a8.ring_buffer.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
           (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
      uVar4 = uVar1;
      if (iVar6 < -1) {
        uVar4 = 0xffffffffffffffff;
      }
      local_a8.channel_count = (int)lVar2;
      local_a8.ring_buffer.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(uVar4);
      LOCK();
      local_a8.ring_buffer.write_index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
      UNLOCK();
      LOCK();
      local_a8.ring_buffer.read_index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
      UNLOCK();
      test_ring<float>(&local_a8,(int)lVar2,(int)uVar5 + 0x1b);
      if ((_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)
          local_a8.ring_buffer.data_._M_t.
          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl != (float *)0x0) {
        operator_delete__((void *)local_a8.ring_buffer.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl);
      }
      uVar5 = uVar5 + 0x1b;
      iVar6 = iVar6 + local_b0;
      uVar1 = uVar1 + lVar7;
    } while (uVar5 < 0x4e2);
    lVar2 = lVar2 + 1;
    iVar3 = iVar3 + 199;
    local_b0 = local_b0 + 0x1b;
    uVar1 = local_88 + 0x31c;
    lVar7 = lVar7 + 0x6c;
  } while (lVar2 != 10);
  lVar2 = 1;
  iVar3 = 199;
  local_b0 = 0x1b;
  uVar1 = 400;
  lVar7 = 0x36;
  do {
    uVar5 = 0xac;
    iVar6 = iVar3;
    local_88 = uVar1;
    do {
      local_a8.ring_buffer.capacity_ = iVar6 + 1;
      local_a8.ring_buffer.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
           (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0;
      uVar4 = uVar1;
      if (iVar6 < -1) {
        uVar4 = 0xffffffffffffffff;
      }
      local_a8.channel_count = (int)lVar2;
      local_a8.ring_buffer.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
      _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl =
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)operator_new__(uVar4);
      LOCK();
      local_a8.ring_buffer.write_index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
      UNLOCK();
      LOCK();
      local_a8.ring_buffer.read_index_.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
      UNLOCK();
      test_ring_multi<short>
                ((lock_free_audio_ring_buffer<short> *)&local_a8,(int)lVar2,(int)uVar5 + 0x1b);
      if (local_a8.ring_buffer.data_._M_t.
          super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
          super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
          super__Head_base<0UL,_float_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<float,_std::default_delete<float[]>_>)0x0) {
        operator_delete__((void *)local_a8.ring_buffer.data_._M_t.
                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                  super__Head_base<0UL,_float_*,_false>._M_head_impl);
      }
      uVar5 = uVar5 + 0x1b;
      iVar6 = iVar6 + local_b0;
      uVar1 = uVar1 + lVar7;
    } while (uVar5 < 0x4e2);
    lVar2 = lVar2 + 1;
    iVar3 = iVar3 + 199;
    local_b0 = local_b0 + 0x1b;
    uVar1 = local_88 + 0x18e;
    lVar7 = lVar7 + 0x36;
  } while (lVar2 != 10);
  test_reset_api();
  if (local_60.data_._M_t.super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
      super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
      super__Head_base<0UL,_short_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<short,_std::default_delete<short[]>_>)0x0) {
    operator_delete__((void *)local_60.data_._M_t.
                              super___uniq_ptr_impl<short,_std::default_delete<short[]>_>._M_t.
                              super__Tuple_impl<0UL,_short_*,_std::default_delete<short[]>_>.
                              super__Head_base<0UL,_short_*,_false>._M_head_impl);
  }
  if ((_Head_base<0UL,_float_*,_false>)
      local_48.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl != (_Head_base<0UL,_float_*,_false>)0x0) {
    operator_delete__((void *)local_48.data_._M_t.
                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

TEST(cubeb, ring_buffer)
{
  /* Basic API test. */
  const int min_channels = 1;
  const int max_channels = 10;
  const int min_capacity = 199;
  const int max_capacity = 1277;
  const int capacity_increment = 27;

  lock_free_queue<float> q1(128);
  basic_api_test(q1);
  lock_free_queue<short> q2(128);
  basic_api_test(q2);

  for (size_t channels = min_channels; channels < max_channels; channels++) {
    lock_free_audio_ring_buffer<float> q3(channels, 128);
    basic_api_test(q3);
    lock_free_audio_ring_buffer<short> q4(channels, 128);
    basic_api_test(q4);
  }

  /* Single thread testing. */
  /* Test mono to 9.1 */
  for (size_t channels = min_channels; channels < max_channels; channels++) {
    /* Use non power-of-two numbers to catch edge-cases. */
    for (size_t capacity_frames = min_capacity;
         capacity_frames < max_capacity; capacity_frames+=capacity_increment) {
      lock_free_audio_ring_buffer<float> ring(channels, capacity_frames);
      test_ring(ring, channels, capacity_frames);
    }
  }

  /* Multi thread testing */
  for (size_t channels = min_channels; channels < max_channels; channels++) {
    /* Use non power-of-two numbers to catch edge-cases. */
    for (size_t capacity_frames = min_capacity;
         capacity_frames < max_capacity; capacity_frames+=capacity_increment) {
      lock_free_audio_ring_buffer<short> ring(channels, capacity_frames);
      test_ring_multi(ring, channels, capacity_frames);
    }
  }

  test_reset_api();
}